

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_reprioritize_stream
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_priority_spec *pri_spec_in)

{
  int iVar1;
  nghttp2_priority_spec *local_50;
  nghttp2_priority_spec *pri_spec;
  nghttp2_priority_spec pri_spec_default;
  nghttp2_stream *dep_stream;
  int rv;
  nghttp2_priority_spec *pri_spec_in_local;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  pri_spec_default.weight = 0;
  pri_spec_default.exclusive = '\0';
  pri_spec_default._9_3_ = 0;
  if (((session->server != '\0') || (session->pending_no_rfc7540_priorities == '\x01')) &&
     ((session->server == '\0' || (iVar1 = session_no_rfc7540_pri_no_fallback(session), iVar1 != 0))
     )) {
    __assert_fail("(!session->server && session->pending_no_rfc7540_priorities != 1) || (session->server && !session_no_rfc7540_pri_no_fallback(session))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x341,
                  "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                 );
  }
  if (pri_spec_in->stream_id == stream->stream_id) {
    __assert_fail("pri_spec->stream_id != stream->stream_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x342,
                  "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                 );
  }
  iVar1 = nghttp2_stream_in_dep_tree(stream);
  if (iVar1 == 0) {
    session_local._4_4_ = 0;
  }
  else {
    local_50 = pri_spec_in;
    if (pri_spec_in->stream_id != 0) {
      pri_spec_default._4_8_ = nghttp2_session_get_stream_raw(session,pri_spec_in->stream_id);
      if (((nghttp2_stream *)pri_spec_default._4_8_ == (nghttp2_stream *)0x0) &&
         (iVar1 = session_detect_idle_stream(session,pri_spec_in->stream_id), iVar1 != 0)) {
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)((long)&pri_spec + 4));
        pri_spec_default._4_8_ =
             nghttp2_session_open_stream
                       (session,pri_spec_in->stream_id,'\0',
                        (nghttp2_priority_spec *)((long)&pri_spec + 4),NGHTTP2_STREAM_IDLE,
                        (void *)0x0);
        if ((nghttp2_stream *)pri_spec_default._4_8_ == (nghttp2_stream *)0x0) {
          return -0x385;
        }
      }
      else if ((pri_spec_default._4_8_ == 0) ||
              (iVar1 = nghttp2_stream_in_dep_tree((nghttp2_stream *)pri_spec_default._4_8_),
              iVar1 == 0)) {
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)((long)&pri_spec + 4));
        local_50 = (nghttp2_priority_spec *)((long)&pri_spec + 4);
      }
    }
    if (local_50->stream_id == 0) {
      pri_spec_default._4_8_ = &session->root;
    }
    else {
      iVar1 = nghttp2_stream_dep_find_ancestor((nghttp2_stream *)pri_spec_default._4_8_,stream);
      if (iVar1 != 0) {
        nghttp2_stream_dep_remove_subtree((nghttp2_stream *)pri_spec_default._4_8_);
        iVar1 = nghttp2_stream_dep_add_subtree
                          (stream->dep_prev,(nghttp2_stream *)pri_spec_default._4_8_);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
    if (pri_spec_default._4_8_ == 0) {
      __assert_fail("dep_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x36a,
                    "int nghttp2_session_reprioritize_stream(nghttp2_session *, nghttp2_stream *, const nghttp2_priority_spec *)"
                   );
    }
    if (((nghttp2_stream *)pri_spec_default._4_8_ == stream->dep_prev) &&
       (local_50->exclusive == '\0')) {
      nghttp2_stream_change_weight(stream,local_50->weight);
      session_local._4_4_ = 0;
    }
    else {
      nghttp2_stream_dep_remove_subtree(stream);
      stream->weight = local_50->weight;
      if (local_50->exclusive == '\0') {
        dep_stream._4_4_ =
             nghttp2_stream_dep_add_subtree((nghttp2_stream *)pri_spec_default._4_8_,stream);
      }
      else {
        dep_stream._4_4_ =
             nghttp2_stream_dep_insert_subtree((nghttp2_stream *)pri_spec_default._4_8_,stream);
      }
      if (dep_stream._4_4_ == 0) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = dep_stream._4_4_;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_reprioritize_stream(
    nghttp2_session *session, nghttp2_stream *stream,
    const nghttp2_priority_spec *pri_spec_in) {
  int rv;
  nghttp2_stream *dep_stream = NULL;
  nghttp2_priority_spec pri_spec_default;
  const nghttp2_priority_spec *pri_spec = pri_spec_in;

  assert((!session->server && session->pending_no_rfc7540_priorities != 1) ||
         (session->server && !session_no_rfc7540_pri_no_fallback(session)));
  assert(pri_spec->stream_id != stream->stream_id);

  if (!nghttp2_stream_in_dep_tree(stream)) {
    return 0;
  }

  if (pri_spec->stream_id != 0) {
    dep_stream = nghttp2_session_get_stream_raw(session, pri_spec->stream_id);

    if (!dep_stream &&
        session_detect_idle_stream(session, pri_spec->stream_id)) {

      nghttp2_priority_spec_default_init(&pri_spec_default);

      dep_stream = nghttp2_session_open_stream(
          session, pri_spec->stream_id, NGHTTP2_FLAG_NONE, &pri_spec_default,
          NGHTTP2_STREAM_IDLE, NULL);

      if (dep_stream == NULL) {
        return NGHTTP2_ERR_NOMEM;
      }
    } else if (!dep_stream || !nghttp2_stream_in_dep_tree(dep_stream)) {
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }
  }

  if (pri_spec->stream_id == 0) {
    dep_stream = &session->root;
  } else if (nghttp2_stream_dep_find_ancestor(dep_stream, stream)) {
    DEBUGF("stream: cycle detected, dep_stream(%p)=%d stream(%p)=%d\n",
           dep_stream, dep_stream->stream_id, stream, stream->stream_id);

    nghttp2_stream_dep_remove_subtree(dep_stream);
    rv = nghttp2_stream_dep_add_subtree(stream->dep_prev, dep_stream);
    if (rv != 0) {
      return rv;
    }
  }

  assert(dep_stream);

  if (dep_stream == stream->dep_prev && !pri_spec->exclusive) {
    /* This is minor optimization when just weight is changed. */
    nghttp2_stream_change_weight(stream, pri_spec->weight);

    return 0;
  }

  nghttp2_stream_dep_remove_subtree(stream);

  /* We have to update weight after removing stream from tree */
  stream->weight = pri_spec->weight;

  if (pri_spec->exclusive) {
    rv = nghttp2_stream_dep_insert_subtree(dep_stream, stream);
  } else {
    rv = nghttp2_stream_dep_add_subtree(dep_stream, stream);
  }

  if (rv != 0) {
    return rv;
  }

  return 0;
}